

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoluj.c
# Opt level: O3

int fffr8u4(double *input,long ntodo,double scale,double zero,int nullcheck,unsigned_long nullval,
           char *nullarray,int *anynull,unsigned_long *output,int *status)

{
  ushort uVar1;
  char cVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  
  if (nullcheck == 0) {
    if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
      if (0 < ntodo) {
        lVar4 = 0;
        do {
          dVar5 = input[lVar4] * scale + zero;
          if (-0.49 <= dVar5) {
            if (dVar5 <= 1.844674407370955e+19) {
              uVar3 = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
            }
            else {
              *status = -0xb;
              uVar3 = 0xffffffffffffffff;
            }
          }
          else {
            *status = -0xb;
            uVar3 = 0;
          }
          output[lVar4] = uVar3;
          lVar4 = lVar4 + 1;
        } while (ntodo != lVar4);
      }
    }
    else if (0 < ntodo) {
      lVar4 = 0;
      do {
        dVar5 = input[lVar4];
        if (-0.49 <= dVar5) {
          if (dVar5 <= 1.844674407370955e+19) {
            uVar3 = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
          }
          else {
            *status = -0xb;
            uVar3 = 0xffffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          uVar3 = 0;
        }
        output[lVar4] = uVar3;
        lVar4 = lVar4 + 1;
      } while (ntodo != lVar4);
    }
  }
  else if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
    if (0 < ntodo) {
      lVar4 = 0;
      do {
        uVar1 = *(ushort *)((long)input + lVar4 * 8 + 6);
        cVar2 = ((uVar1 & 0x7ff0) == 0) * '\x02';
        if ((uVar1 & 0x7ff0) == 0x7ff0) {
          cVar2 = '\x01';
        }
        if (cVar2 == '\0') {
          dVar5 = input[lVar4] * scale + zero;
          if (dVar5 < -0.49) {
LAB_0016881c:
            *status = -0xb;
            output[lVar4] = 0;
          }
          else if (1.844674407370955e+19 < dVar5) {
LAB_00168839:
            *status = -0xb;
            output[lVar4] = 0xffffffffffffffff;
          }
          else {
            output[lVar4] =
                 (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
          }
        }
        else if (cVar2 == '\x01') {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar4] = nullval;
          }
          else {
            nullarray[lVar4] = '\x01';
          }
        }
        else {
          if (zero < -0.49) goto LAB_0016881c;
          if (1.844674407370955e+19 < zero) goto LAB_00168839;
          output[lVar4] = (long)(zero - 9.223372036854776e+18) & (long)zero >> 0x3f | (long)zero;
        }
        lVar4 = lVar4 + 1;
      } while (ntodo != lVar4);
    }
  }
  else if (0 < ntodo) {
    lVar4 = 0;
    do {
      uVar1 = *(ushort *)((long)input + lVar4 * 8 + 6);
      cVar2 = ((uVar1 & 0x7ff0) == 0) * '\x02';
      if ((uVar1 & 0x7ff0) == 0x7ff0) {
        cVar2 = '\x01';
      }
      if (cVar2 == '\0') {
        dVar5 = input[lVar4];
        if (dVar5 < -0.49) {
          *status = -0xb;
          goto LAB_0016865c;
        }
        if (dVar5 <= 1.844674407370955e+19) {
          output[lVar4] = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
        }
        else {
          *status = -0xb;
          output[lVar4] = 0xffffffffffffffff;
        }
      }
      else if (cVar2 == '\x01') {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar4] = nullval;
        }
        else {
          nullarray[lVar4] = '\x01';
        }
      }
      else {
LAB_0016865c:
        output[lVar4] = 0;
      }
      lVar4 = lVar4 + 1;
    } while (ntodo != lVar4);
  }
  return *status;
}

Assistant:

int fffr8u4(double *input,        /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
   unsigned long nullval,         /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
   unsigned long *output,         /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to NaN.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;
    short *sptr, iret;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < DULONG_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (input[ii] > DULONG_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = ULONG_MAX;
                }
                else
                    output[ii] = (unsigned long) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DULONG_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (dvalue > DULONG_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = ULONG_MAX;
                }
                else
                    output[ii] = (unsigned long) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        sptr = (short *) input;

#if BYTESWAPPED && MACHINE != VAXVMS && MACHINE != ALPHAVMS
        sptr += 3;       /* point to MSBs */
#endif
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++, sptr += 4)
            {
              if (0 != (iret = dnan(*sptr)) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                     output[ii] = 0;
              }
              else
                {
                    if (input[ii] < DULONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (input[ii] > DULONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = ULONG_MAX;
                    }
                    else
                        output[ii] = (unsigned long) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++, sptr += 4)
            {
              if (0 != (iret = dnan(*sptr)) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {  
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                  { 
                    if (zero < DULONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (zero > DULONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = ULONG_MAX;
                    }
                    else
                      output[ii] = (unsigned long) zero;
                  }
              }
              else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DULONG_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (dvalue > DULONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = ULONG_MAX;
                    }
                    else
                        output[ii] = (unsigned long) dvalue;
                }
            }
        }
    }
    return(*status);
}